

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.cpp
# Opt level: O1

void __thiscall IZDeflate::fill_window(IZDeflate *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  while( true ) {
    uVar2 = this->lookahead;
    uVar1 = this->strstart;
    uVar4 = ((int)this->window_size - uVar2) - uVar1;
    if (uVar4 == 0xffffffff) {
      uVar4 = 0xfffffffe;
    }
    else if ((0xfef9 < uVar1) && (this->sliding != 0)) {
      memcpy(this->window,this->window + 0x8000,0x8000);
      this->match_start = this->match_start - 0x8000;
      this->strstart = uVar1 - 0x8000;
      this->block_start = this->block_start + -0x8000;
      lVar3 = 0;
      do {
        this->head[lVar3] = (short)this->head[lVar3] >> 0xf & (this->head[lVar3] ^ 0x8000);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x8000);
      lVar3 = 0;
      do {
        this->prev[lVar3] = (short)this->prev[lVar3] >> 0xf & (this->prev[lVar3] ^ 0x8000);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x8000);
      uVar4 = uVar4 + 0x8000;
    }
    if (this->eofile != 0) break;
    uVar2 = (*this->read_buf)(this->read_handle,
                              (char *)(this->window + (ulong)uVar2 + (ulong)this->strstart),uVar4);
    if (uVar2 + 1 < 2) {
      this->eofile = 1;
    }
    else {
      this->lookahead = this->lookahead + uVar2;
    }
    if (0x105 < this->lookahead) {
      return;
    }
    if (this->eofile != 0) {
      return;
    }
  }
  return;
}

Assistant:

void IZDeflate::fill_window()
{
    unsigned n, m;
    unsigned more; /* Amount of free space at the end of the window. */

    do {
        more = (unsigned)(window_size - (ulg)lookahead - (ulg)strstart);

        /* If the window is almost full and there is insufficient lookahead,
         * move the upper half to the lower one to make room in the upper half.
         */
        if (more == (unsigned)EOF) {
            /* Very unlikely, but possible on 16 bit machine if strstart == 0
             * and lookahead == 1 (input done one byte at time)
             */
            more--;

            /* For MMAP or BIG_MEM, the whole input file is already in memory so
             * we must not perform sliding. We must however call (*read_buf)()
             * in order to compute the crc, update lookahead and possibly set
             * eofile.
             */
        } else if (strstart >= WSIZE + MAX_DIST && sliding) {

#    ifdef FORCE_METHOD
            /* When methods "stored" or "store_block" are requested, the
             * current block must be flushed before sliding the window.
             */
            if (level <= 2) FLUSH_BLOCK(0), block_start = strstart;
#    endif
            /* By the IN assertion, the window is not empty so we can't confuse
             * more == 0 with more == 64K on a 16 bit machine.
             */
            memcpy((char*)window, (char*)window + WSIZE, (unsigned)WSIZE);
            match_start -= WSIZE;
            strstart -= WSIZE; /* we now have strstart >= MAX_DIST: */

            block_start -= (long)WSIZE;

            for (n = 0; n < HASH_SIZE; n++) {
                m = head[n];
                head[n] = (Pos)(m >= WSIZE ? m - WSIZE : NIL);
            }
            for (n = 0; n < WSIZE; n++) {
                m = prev[n];
                prev[n] = (Pos)(m >= WSIZE ? m - WSIZE : NIL);
                /* If n is not on any hash chain, prev[n] is garbage but
                 * its value will never be used.
                 */
            }
            more += WSIZE;
        }
        if (eofile) return;

        /* If there was no sliding:
         *    strstart <= WSIZE+MAX_DIST-1 && lookahead <= MIN_LOOKAHEAD - 1 &&
         *    more == window_size - lookahead - strstart
         * => more >= window_size - (MIN_LOOKAHEAD-1 + WSIZE + MAX_DIST-1)
         * => more >= window_size - 2*WSIZE + 2
         * In the MMAP or BIG_MEM case (not yet supported in gzip),
         *   window_size == input_size + MIN_LOOKAHEAD  &&
         *   strstart + lookahead <= input_size => more >= MIN_LOOKAHEAD.
         * Otherwise, window_size == 2*WSIZE so more >= 2.
         * If there was sliding, more >= WSIZE. So in all cases, more >= 2.
         */
        Assert(more >= 2, "more < 2");

        n = (*read_buf)(read_handle, (char*)window + strstart + lookahead,
                        more);
        if (n == 0 || n == (unsigned)EOF) {
            eofile = 1;
        } else {
            lookahead += n;
        }
    } while (lookahead < MIN_LOOKAHEAD && !eofile);
}